

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O3

bool q_evaluateRhiConfig(QWidget *w,QPlatformBackingStoreRhiConfig *outConfig,SurfaceType *outType)

{
  QDebug QVar1;
  char cVar2;
  bool bVar3;
  QWidget *this;
  long in_FS_OFFSET;
  QByteArrayView QVar4;
  QByteArrayView QVar5;
  QByteArrayView QVar6;
  QByteArrayView QVar7;
  QWidget local_80;
  QDebug local_58;
  undefined1 local_50 [8];
  QDebug local_48;
  QArrayData *local_40 [3];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  cVar2 = QBackingStoreRhiSupport::checkForceRhi(outConfig,outType);
  if (cVar2 == '\0') {
    bVar3 = q_evaluateRhiConfigRecursive(w,outConfig,outType);
    if (!bVar3) {
      bVar3 = false;
      goto LAB_002f7785;
    }
    QtPrivateLogging::lcWidgetPainting();
    bVar3 = true;
    if (((byte)QtPrivateLogging::lcWidgetPainting::category.field_2.bools.enabledDebug._q_value.
               _M_base._M_i & 1) == 0) goto LAB_002f7785;
    local_80._8_4_ = 2;
    local_80._12_4_ = 0;
    local_80.super_QPaintDevice = (QPaintDevice)0x0;
    local_80._17_3_ = 0;
    local_80._20_8_ = 0;
    local_80._28_4_ = 0;
    local_80.data = (QWidgetData *)QtPrivateLogging::lcWidgetPainting::category.name;
    QMessageLogger::debug();
    QVar1.stream = local_58.stream;
    QVar6.m_data = (storage_type *)0xe;
    QVar6.m_size = (qsizetype)local_40;
    QString::fromUtf8(QVar6);
    QTextStream::operator<<((QTextStream *)QVar1.stream,(QString *)local_40);
    if (local_40[0] != (QArrayData *)0x0) {
      LOCK();
      (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_40[0],2,0x10);
      }
    }
    if (*(QTextStream *)(local_58.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_58.stream,' ');
    }
    *(int *)((QTextStream *)local_58.stream + 0x28) =
         *(int *)((QTextStream *)local_58.stream + 0x28) + 1;
    operator<<((Stream *)&local_48,&local_80);
    QVar1.stream = local_48.stream;
    QVar7.m_data = (storage_type *)0x1f;
    QVar7.m_size = (qsizetype)local_40;
    QString::fromUtf8(QVar7);
    QTextStream::operator<<((QTextStream *)QVar1.stream,(QString *)local_40);
    if (local_40[0] != (QArrayData *)0x0) {
      LOCK();
      (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_40[0],2,0x10);
      }
    }
    if (*(QTextStream *)(local_48.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_48.stream,' ');
    }
    QDebug::~QDebug(&local_48);
    this = &local_80;
  }
  else {
    QtPrivateLogging::lcWidgetPainting();
    bVar3 = true;
    if (((byte)QtPrivateLogging::lcWidgetPainting::category.field_2.bools.enabledDebug._q_value.
               _M_base._M_i & 1) == 0) goto LAB_002f7785;
    local_80._8_4_ = 2;
    local_80._12_4_ = 0;
    local_80.super_QPaintDevice = (QPaintDevice)0x0;
    local_80._17_3_ = 0;
    local_80._20_8_ = 0;
    local_80._28_4_ = 0;
    local_80.data = (QWidgetData *)QtPrivateLogging::lcWidgetPainting::category.name;
    QMessageLogger::debug();
    QVar1.stream = local_58.stream;
    QVar4.m_data = (storage_type *)0xe;
    QVar4.m_size = (qsizetype)local_40;
    QString::fromUtf8(QVar4);
    QTextStream::operator<<((QTextStream *)QVar1.stream,(QString *)local_40);
    if (local_40[0] != (QArrayData *)0x0) {
      LOCK();
      (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_40[0],2,0x10);
      }
    }
    if (*(QTextStream *)(local_58.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_58.stream,' ');
    }
    *(int *)((QTextStream *)local_58.stream + 0x28) =
         *(int *)((QTextStream *)local_58.stream + 0x28) + 1;
    operator<<((Stream *)&local_48,(QWidget *)local_50);
    QVar1.stream = local_48.stream;
    QVar5.m_data = (storage_type *)0x26;
    QVar5.m_size = (qsizetype)local_40;
    QString::fromUtf8(QVar5);
    QTextStream::operator<<((QTextStream *)QVar1.stream,(QString *)local_40);
    if (local_40[0] != (QArrayData *)0x0) {
      LOCK();
      (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_40[0],2,0x10);
      }
    }
    if (*(QTextStream *)(local_48.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_48.stream,' ');
    }
    QDebug::~QDebug(&local_48);
    this = (QWidget *)local_50;
  }
  bVar3 = true;
  QDebug::~QDebug((QDebug *)this);
  QDebug::~QDebug(&local_58);
LAB_002f7785:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool q_evaluateRhiConfig(const QWidget *w, QPlatformBackingStoreRhiConfig *outConfig, QSurface::SurfaceType *outType)
{
    // First, check env.vars. or other means that force the usage of rhi-based
    // flushing with a specific graphics API. This takes precedence over what
    // the widgets themselves declare. This is global, applying to all
    // top-levels.
    if (QBackingStoreRhiSupport::checkForceRhi(outConfig, outType)) {
        qCDebug(lcWidgetPainting) << "Tree with root" << w << "evaluated to forced flushing with QRhi";
        return true;
    }

    // Otherwise, check the widget hierarchy to see if there is a child (or
    // ourselves) that declare the need for rhi-based composition.
    if (q_evaluateRhiConfigRecursive(w, outConfig, outType)) {
        qCDebug(lcWidgetPainting) << "Tree with root" << w << "evaluates to flushing with QRhi";
        return true;
    }

    return false;
}